

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  
  if (-1 < i_start) {
    iVar1 = (GImGui->WindowsFocusOrder).Size;
    do {
      if (i_stop == i_start) {
        return (ImGuiWindow *)0x0;
      }
      if (iVar1 <= i_start) {
        return (ImGuiWindow *)0x0;
      }
      pIVar2 = (GImGui->WindowsFocusOrder).Data[(uint)i_start];
      if (((pIVar2->WasActive == true) && (pIVar2->RootWindow == pIVar2)) &&
         ((pIVar2->Flags & 0x80000) == 0)) {
        if (iVar1 <= i_start) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                        ,0x703,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        return pIVar2;
      }
      i_start = i_start + dir;
    } while (-1 < i_start);
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}